

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O0

int ccm_auth_decrypt(mbedtls_ccm_context *ctx,int mode,size_t length,uchar *iv,size_t iv_len,
                    uchar *add,size_t add_len,uchar *input,uchar *output,uchar *tag,size_t tag_len)

{
  uchar local_68 [8];
  uchar check_tag [16];
  int ret;
  uchar *add_local;
  size_t iv_len_local;
  uchar *iv_local;
  size_t length_local;
  int mode_local;
  mbedtls_ccm_context *ctx_local;
  
  check_tag[0xc] = 0x92;
  check_tag[0xd] = 0xff;
  check_tag[0xe] = 0xff;
  check_tag[0xf] = 0xff;
  check_tag._12_4_ =
       ccm_auth_crypt(ctx,mode,length,iv,iv_len,add,add_len,input,output,local_68,tag_len);
  ctx_local._4_4_ = check_tag._12_4_;
  if (check_tag._12_4_ == 0) {
    check_tag._12_4_ = mbedtls_ccm_compare_tags(tag,local_68,tag_len);
    if (check_tag._12_4_ == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      mbedtls_platform_zeroize(output,length);
      ctx_local._4_1_ = check_tag[0xc];
      ctx_local._5_1_ = check_tag[0xd];
      ctx_local._6_1_ = check_tag[0xe];
      ctx_local._7_1_ = check_tag[0xf];
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int ccm_auth_decrypt(mbedtls_ccm_context *ctx, int mode, size_t length,
                            const unsigned char *iv, size_t iv_len,
                            const unsigned char *add, size_t add_len,
                            const unsigned char *input, unsigned char *output,
                            const unsigned char *tag, size_t tag_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char check_tag[16];

    if ((ret = ccm_auth_crypt(ctx, mode, length,
                              iv, iv_len, add, add_len,
                              input, output, check_tag, tag_len)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ccm_compare_tags(tag, check_tag, tag_len)) != 0) {
        mbedtls_platform_zeroize(output, length);
        return ret;
    }

    return 0;
}